

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractListView<QImage>::mousePressEvent(AbstractListView<QImage> *this,QMouseEvent *e)

{
  MouseButton MVar1;
  AbstractListViewPrivate<QImage> *pAVar2;
  long lVar3;
  AbstractListViewPrivate<QImage> *d;
  QMouseEvent *e_local;
  AbstractListView<QImage> *this_local;
  
  AbstractScrollArea::mousePressEvent((AbstractScrollArea *)this,e);
  pAVar2 = d_func(this);
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  if (MVar1 == LeftButton) {
    lVar3 = QElapsedTimer::elapsed();
    if (500 < lVar3) {
      pAVar2->clickCount = 0;
    }
    pAVar2->mouseMoveDelta = 0;
    QTimer::start((int)pAVar2->timer);
    QElapsedTimer::start();
  }
  return;
}

Assistant:

void mousePressEvent( QMouseEvent * e ) override
	{
		AbstractListViewBase::mousePressEvent( e );

		AbstractListViewPrivate< T > * d = d_func();

		if( e->button() == Qt::LeftButton )
		{
			if( d->elapsedTimer.elapsed() > 500 )
				d->clickCount = 0;

			d->mouseMoveDelta = 0;
			d->timer->start( 2000 );
			d->elapsedTimer.start();
		}
	}